

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O2

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitMinMax
          (AsmJSByteCodeGenerator *this,ParseNode *pnode,AsmJsMathFunction *mathFunction)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  ArgSlot AVar4;
  AsmJsType AVar5;
  uint R0;
  undefined4 *puVar6;
  ParseNodeCall *pPVar7;
  Memory *pMVar8;
  AsmJsType *ptr;
  EmitExpressionInfo *ptr_00;
  ParseNode *pPVar9;
  ParseNode *pPVar10;
  EmitExpressionInfo EVar11;
  ParseNode *pPVar12;
  undefined4 extraout_var;
  AsmJsCompilationException *pAVar13;
  long lVar14;
  ulong uVar15;
  undefined1 local_b0 [8];
  TrackAllocData data;
  AutoArrayPtr<Js::AsmJsType> local_78;
  uint local_68;
  uint local_64;
  long local_60;
  uint local_54;
  OpCodeAsmJs local_4e;
  AsmJsType local_4c;
  undefined1 auStack_48 [2];
  OpCodeAsmJs op;
  size_t sStack_40;
  
  if ((mathFunction->super_AsmJsFunctionDeclaration).mArgCount != 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x519,"(mathFunction->GetArgCount() == 2)",
                                "mathFunction->GetArgCount() == 2");
    if (!bVar3) {
LAB_008675d0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pPVar7 = ParseNode::AsParseNodeCall(pnode);
  uVar1 = pPVar7->argCount;
  pPVar7 = ParseNode::AsParseNodeCall(pnode);
  local_54 = (uint)uVar1;
  if (local_54 < 2) {
    pAVar13 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (pAVar13,L"Math builtin function doesn\'t support arguments");
    __cxa_throw(pAVar13,&AsmJsCompilationException::typeinfo,0);
  }
  pPVar10 = pPVar7->pnodeArgs;
  local_78.super_BasePtr<Js::AsmJsType>.ptr = (AsmJsType *)0x0;
  local_78.m_elementCount = 0;
  _auStack_48 = (EmitExpressionInfo *)0x0;
  sStack_40 = 0;
  data.plusSize = (size_t)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  local_b0 = (undefined1  [8])&AsmJsType::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4406ba5;
  data.filename._0_4_ = 0x524;
  pMVar8 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
  ptr = Memory::AllocateArray<Memory::HeapAllocator,Js::AsmJsType,false>
                  (pMVar8,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                   (ulong)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount);
  AutoArrayPtr<Js::AsmJsType>::Set
            (&local_78,ptr,(uint)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount);
  data.plusSize = (size_t)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
  local_b0 = (undefined1  [8])&EmitExpressionInfo::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4406ba5;
  data.filename._0_4_ = 0x525;
  pMVar8 = (Memory *)
           Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
  ptr_00 = Memory::AllocateArray<Memory::HeapAllocator,Js::EmitExpressionInfo,false>
                     (pMVar8,(HeapAllocator *)Memory::HeapAllocator::Alloc,0,
                      (ulong)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount);
  AutoArrayPtr<Js::EmitExpressionInfo>::Set
            ((AutoArrayPtr<Js::EmitExpressionInfo> *)auStack_48,ptr_00,
             (uint)(mathFunction->super_AsmJsFunctionDeclaration).mArgCount);
  pPVar9 = ParserWrapper::GetBinaryLeft(pPVar10);
  pPVar10 = ParserWrapper::GetBinaryRight(pPVar10);
  EVar11 = Emit(this,pPVar9);
  *_auStack_48 = EVar11;
  (local_78.super_BasePtr<Js::AsmJsType>.ptr)->which_ = (_auStack_48->type).which_;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_68 = 1;
  local_60 = 0xd;
  uVar15 = 0xffffffffffffffff;
  do {
    if (local_68 == local_54) {
      AutoArrayPtr<Js::EmitExpressionInfo>::~AutoArrayPtr
                ((AutoArrayPtr<Js::EmitExpressionInfo> *)auStack_48);
      AutoArrayPtr<Js::AsmJsType>::~AutoArrayPtr(&local_78);
      return (EmitExpressionInfo)(uVar15 & 0xffffffff | local_60 << 0x20);
    }
    pPVar9 = pPVar10;
    if (pPVar10->nop == knopList) {
      pPVar12 = ParserWrapper::GetBinaryLeft(pPVar10);
      pPVar9 = ParserWrapper::GetBinaryRight(pPVar10);
      pPVar10 = pPVar12;
    }
    EVar11 = Emit(this,pPVar10);
    _auStack_48[1] = EVar11;
    local_78.super_BasePtr<Js::AsmJsType>.ptr[1].which_ = _auStack_48[1].type.which_;
    AsmJsRetType::AsmJsRetType((AsmJsRetType *)local_b0);
    bVar3 = AsmJsMathFunction::SupportsMathCall
                      (mathFunction,(mathFunction->super_AsmJsFunctionDeclaration).mArgCount,
                       local_78.super_BasePtr<Js::AsmJsType>.ptr,&local_4e,(AsmJsRetType *)local_b0)
    ;
    if (!bVar3) {
      pAVar13 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (pAVar13,L"Math builtin function doesn\'t support arguments");
      __cxa_throw(pAVar13,&AsmJsCompilationException::typeinfo,0);
    }
    AVar4 = AsmJsFunctionDeclaration::GetArgByteSize
                      (&mathFunction->super_AsmJsFunctionDeclaration,(ArgSlot)local_54);
    AsmJsFunc::UpdateMaxArgOutDepth(this->mFunction,(AVar4 + 8 >> 3) + 2);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,_auStack_48 + 1);
    AsmJsFunc::ReleaseLocationGeneric(this->mFunction,_auStack_48);
    AVar5 = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    local_60 = CONCAT44(extraout_var,AVar5.which_);
    local_4c = AsmJsRetType::toType((AsmJsRetType *)local_b0);
    bVar3 = AsmJsType::isSigned(&local_4c);
    if (bVar3) {
      R0 = AsmJsFunc::AcquireTmpRegister<int>(this->mFunction);
    }
    else {
      local_4c = AsmJsRetType::toType((AsmJsRetType *)local_b0);
      bVar3 = AsmJsType::isDouble(&local_4c);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                    ,0x557,"(retType.toType().isDouble())",
                                    "retType.toType().isDouble()");
        if (!bVar3) goto LAB_008675d0;
        *puVar6 = 0;
      }
      R0 = AsmJsFunc::AcquireTmpRegister<double>(this->mFunction);
    }
    AsmJsByteCodeWriter::AsmReg3
              (&this->mWriter,local_4e,R0,(_auStack_48->super_EmitInfoBase).location,
               _auStack_48[1].super_EmitInfoBase.location);
    *_auStack_48 = (EmitExpressionInfo)((ulong)R0 | local_60 << 0x20);
    lVar14 = 0;
    data._32_8_ = pPVar9;
    local_64 = R0;
    for (uVar15 = 0; uVar15 < (mathFunction->super_AsmJsFunctionDeclaration).mArgCount;
        uVar15 = uVar15 + 1) {
      bVar3 = AsmJsType::isSubType
                        ((AsmJsType *)((long)&(_auStack_48->type).which_ + lVar14),(AsmJsType)0x4);
      if (bVar3) {
        bVar3 = AsmJsFunc::IsValidLocation<double>
                          (this->mFunction,
                           (EmitExpressionInfo *)
                           ((long)&(_auStack_48->super_EmitInfoBase).location + lVar14));
        if (!bVar3) {
          pAVar13 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (pAVar13,L"Invalid Node location[%d] ",
                     (ulong)*(uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar14));
LAB_008675f8:
          __cxa_throw(pAVar13,&AsmJsCompilationException::typeinfo,0);
        }
      }
      else {
        bVar3 = AsmJsType::isSubType
                          ((AsmJsType *)((long)&(_auStack_48->type).which_ + lVar14),(AsmJsType)0xc)
        ;
        if (bVar3) {
          bVar3 = AsmJsFunc::IsValidLocation<int>
                            (this->mFunction,
                             (EmitExpressionInfo *)
                             ((long)&(_auStack_48->super_EmitInfoBase).location + lVar14));
          if (!bVar3) {
            pAVar13 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
            AsmJsCompilationException::AsmJsCompilationException
                      (pAVar13,L"Invalid Node location[%d] ",
                       (ulong)*(uint *)((long)&(_auStack_48->super_EmitInfoBase).location + lVar14))
            ;
            goto LAB_008675f8;
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                      ,0x56b,"((0))","UNREACHED");
          if (!bVar3) goto LAB_008675d0;
          *puVar6 = 0;
        }
      }
      lVar14 = lVar14 + 8;
    }
    local_68 = local_68 + 1;
    uVar15 = (ulong)local_64;
    pPVar10 = (ParseNode *)data._32_8_;
  } while( true );
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitMinMax(ParseNode* pnode, AsmJsMathFunction* mathFunction)
    {
        Assert(mathFunction->GetArgCount() == 2);
        uint16 argCount = pnode->AsParseNodeCall()->argCount;
        ParseNode* argNode = pnode->AsParseNodeCall()->pnodeArgs;

        if (argCount < 2)
        {
            throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
        }

        AutoArrayPtr<AsmJsType> types(nullptr, 0);
        AutoArrayPtr<EmitExpressionInfo> argsInfo(nullptr, 0);
        types.Set(HeapNewArray(AsmJsType, mathFunction->GetArgCount()), mathFunction->GetArgCount());
        argsInfo.Set(HeapNewArray(EmitExpressionInfo, mathFunction->GetArgCount()), mathFunction->GetArgCount());

        ParseNode * arg = ParserWrapper::GetBinaryLeft(argNode);
        argNode = ParserWrapper::GetBinaryRight(argNode);
        // Emit first arg as arg0
        argsInfo[0] = Emit(arg);
        types[0] = argsInfo[0].type;

        EmitExpressionInfo dstInfo;
        for (int i = 1; i < argCount; i++)
        {
            if (argNode->nop == knopList)
            {
                arg = ParserWrapper::GetBinaryLeft(argNode);
                argNode = ParserWrapper::GetBinaryRight(argNode);
            }
            else
            {
                arg = argNode;
            }
            // arg1 will always be the next arg in the argList
            argsInfo[1] = Emit(arg);
            types[1] = argsInfo[1].type;

            // Check if this function supports the type of these arguments
            AsmJsRetType retType;
            OpCodeAsmJs op;
            const bool supported = mathFunction->SupportsMathCall(mathFunction->GetArgCount(), types, op, retType);
            if (!supported)
            {
                throw AsmJsCompilationException(_u("Math builtin function doesn't support arguments"));
            }

            const int argByteSize = mathFunction->GetArgByteSize(argCount) + sizeof(Var);
            // +1 is for function object
            int runtimeArg = (int)(::ceil((double)(argByteSize / sizeof(Var)))) + 1;
            // +1 is for return address

            // Make sure we have enough memory allocated for OutParameters
            mFunction->UpdateMaxArgOutDepth(runtimeArg + 1);
            mFunction->ReleaseLocationGeneric(&argsInfo[1]);
            mFunction->ReleaseLocationGeneric(&argsInfo[0]);

            dstInfo.type = retType.toType();
            if (retType.toType().isSigned())
            {
                dstInfo.location = mFunction->AcquireTmpRegister<int>();
            }
            else
            {
                Assert(retType.toType().isDouble());
                dstInfo.location = mFunction->AcquireTmpRegister<double>();
            }

            mWriter.AsmReg3(op, dstInfo.location, argsInfo[0].location, argsInfo[1].location);
            // for max/min calls with more than 2 arguments, we use the result of previous call for arg0
            argsInfo[0] = dstInfo;
#if DBG
            for (uint j = 0; j < mathFunction->GetArgCount(); j++)
            {
                if (argsInfo[j].type.isSubType(AsmJsType::MaybeDouble))
                {
                    CheckNodeLocation(argsInfo[j], double);
                }
                else if (argsInfo[j].type.isSubType(AsmJsType::Intish))
                {
                    CheckNodeLocation(argsInfo[j], int);
                }
                else
                {
                    Assert(UNREACHED);
                }
            }
#endif
        }
        return dstInfo;
    }